

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t mime_subparts_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  curl_mimepart *pcVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (nitems == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      uVar2 = 0;
      if (8 < *(uint *)((long)instream + 0x28)) goto switchD_0013c2f3_caseD_1;
      pcVar1 = *(curl_mimepart **)((long)instream + 0x30);
      switch(*(uint *)((long)instream + 0x28)) {
      case 0:
      case 4:
        *(undefined4 *)((long)instream + 0x28) = 5;
        *(undefined8 *)((long)instream + 0x30) = *(undefined8 *)((long)instream + 0x10);
        *(undefined8 *)((long)instream + 0x38) = 2;
        goto LAB_0013c451;
      case 5:
        uVar7 = *(ulong *)((long)instream + 0x38);
        if (3 < uVar7) {
          *(undefined4 *)((long)instream + 0x28) = 6;
          goto LAB_0013c430;
        }
        uVar2 = 4 - uVar7;
        if (nitems <= 4 - uVar7) {
          uVar2 = nitems;
        }
        memcpy(buffer,"\r\n--" + uVar7,uVar2);
        *(long *)((long)instream + 0x38) = *(long *)((long)instream + 0x38) + uVar2;
        break;
      case 6:
        pcVar6 = *(char **)((long)instream + 0x20);
        sVar3 = strlen(pcVar6);
        uVar2 = *(ulong *)((long)instream + 0x38);
        uVar7 = uVar2 - sVar3;
        if (uVar2 < sVar3) {
          uVar4 = sVar3 - uVar2;
          pcVar6 = pcVar6 + uVar2;
LAB_0013c3f1:
          uVar2 = nitems;
          if (uVar4 < nitems) {
            uVar2 = uVar4;
          }
          memcpy(buffer,pcVar6,uVar2);
          *(long *)((long)instream + 0x38) = *(long *)((long)instream + 0x38) + uVar2;
          if (uVar4 != 0) break;
        }
        else {
          pcVar6 = "\r\n";
          if (pcVar1 == (curl_mimepart *)0x0) {
            pcVar6 = "--\r\n";
          }
          uVar2 = (ulong)(pcVar1 == (curl_mimepart *)0x0) * 2 + 2;
          uVar4 = uVar2 - uVar7;
          if (uVar7 <= uVar2 && uVar4 != 0) {
            pcVar6 = pcVar6 + uVar7;
            goto LAB_0013c3f1;
          }
        }
        *(undefined4 *)((long)instream + 0x28) = 7;
LAB_0013c430:
        *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
        *(undefined8 *)((long)instream + 0x38) = 0;
LAB_0013c451:
        uVar2 = 0;
        break;
      case 7:
        if (pcVar1 == (curl_mimepart *)0x0) {
          *(undefined4 *)((long)instream + 0x28) = 8;
          *(undefined8 *)((long)instream + 0x30) = 0;
          *(undefined8 *)((long)instream + 0x38) = 0;
          goto LAB_0013c451;
        }
        uVar2 = readback_part(pcVar1,buffer,nitems);
        if (uVar2 == 0) {
          pcVar1 = pcVar1->nextpart;
          *(undefined4 *)((long)instream + 0x28) = 5;
          *(curl_mimepart **)((long)instream + 0x30) = pcVar1;
          *(undefined8 *)((long)instream + 0x38) = 0;
          uVar2 = 0;
        }
        else if ((uVar2 - 0x10000000 < 2) || (uVar2 == 0xffffffffffffffff)) {
          if (sVar5 != 0) {
            return sVar5;
          }
          return uVar2;
        }
        break;
      case 8:
        goto switchD_0013c2f3_caseD_8;
      }
switchD_0013c2f3_caseD_1:
      sVar5 = sVar5 + uVar2;
      buffer = buffer + uVar2;
      nitems = nitems - uVar2;
    } while (nitems != 0);
  }
switchD_0013c2f3_caseD_8:
  return sVar5;
}

Assistant:

static size_t mime_subparts_read(char *buffer, size_t size, size_t nitems,
                                 void *instream)
{
  curl_mime *mime = (curl_mime *) instream;
  size_t cursize = 0;
  size_t sz;
  curl_mimepart *part;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  (void) size;   /* Always 1. */

  while(nitems) {
    sz = 0;
    part = mime->state.ptr;
    switch(mime->state.state) {
    case MIMESTATE_BEGIN:
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      convbuf = buffer;
#endif
      mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, mime->firstpart);
      /* The first boundary always follows the header termination empty line,
         so is always preceded by a CRLK. We can then spare 2 characters
         by skipping the leading CRLF in boundary. */
      mime->state.offset += 2;
      break;
    case MIMESTATE_BOUNDARY1:
      sz = readback_bytes(&mime->state, buffer, nitems, "\r\n--", 4, "");
      if(!sz)
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY2, part);
      break;
    case MIMESTATE_BOUNDARY2:
      sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                          strlen(mime->boundary), part? "\r\n": "--\r\n");
      if(!sz) {
#ifdef CURL_DOES_CONVERSIONS
        if(mime->easy && convbuf < buffer) {
          CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                    buffer - convbuf);
          if(result)
            return READ_ERROR;
          convbuf = buffer;
        }
#endif
        mimesetstate(&mime->state, MIMESTATE_CONTENT, part);
      }
      break;
    case MIMESTATE_CONTENT:
      if(!part) {
        mimesetstate(&mime->state, MIMESTATE_END, NULL);
        break;
      }
      sz = readback_part(part, buffer, nitems);
      switch(sz) {
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      case 0:
#ifdef CURL_DOES_CONVERSIONS
        convbuf = buffer;
#endif
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, part->nextpart);
        break;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* other values not used in mime state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    nitems -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(mime->easy && convbuf < buffer &&
         mime->state.state <= MIMESTATE_CONTENT) {
        CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}